

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# EDCircles.cpp
# Opt level: O2

void EDCircles::choldc(double **a,int n,double **l)

{
  uint uVar1;
  void *__s;
  double **ppdVar2;
  ulong uVar3;
  long lVar4;
  ulong uVar5;
  ulong uVar6;
  int iVar7;
  double **ppdVar8;
  double dVar9;
  
  uVar1 = n + 1;
  uVar6 = 0xffffffffffffffff;
  if (-2 < n) {
    uVar6 = (long)(int)uVar1 << 3;
  }
  __s = operator_new__(uVar6);
  memset(__s,0,(long)(int)uVar1 << 3);
  iVar7 = 0;
  if (0 < n) {
    iVar7 = n;
  }
  for (uVar6 = 1; uVar5 = uVar6, uVar6 != iVar7 + 1; uVar6 = uVar6 + 1) {
    for (; uVar5 != uVar1; uVar5 = uVar5 + 1) {
      dVar9 = a[uVar6][uVar5];
      for (uVar3 = uVar6; 1 < (long)uVar3; uVar3 = uVar3 - 1) {
        dVar9 = dVar9 - a[uVar6][uVar3 - 1] * a[uVar5][uVar3 - 1];
      }
      if (uVar6 == uVar5) {
        if (0.0 < dVar9) {
          if (dVar9 < 0.0) {
            dVar9 = sqrt(dVar9);
          }
          else {
            dVar9 = SQRT(dVar9);
          }
          *(double *)((long)__s + uVar6 * 8) = dVar9;
        }
      }
      else {
        a[uVar5][uVar6] = dVar9 / *(double *)((long)__s + uVar6 * 8);
      }
    }
  }
  ppdVar2 = l + 1;
  ppdVar8 = a + 1;
  for (uVar6 = 1; uVar6 != iVar7 + 1; uVar6 = uVar6 + 1) {
    for (lVar4 = 0; (uVar6 - uVar1) + lVar4 != 0; lVar4 = lVar4 + 1) {
      if (lVar4 == 0) {
        dVar9 = *(double *)((long)__s + uVar6 * 8);
        uVar5 = uVar6;
      }
      else {
        ppdVar2[lVar4][uVar6] = ppdVar8[lVar4][uVar6];
        dVar9 = 0.0;
        uVar5 = uVar6 + lVar4;
      }
      l[uVar6][uVar5] = dVar9;
    }
    ppdVar2 = ppdVar2 + 1;
    ppdVar8 = ppdVar8 + 1;
  }
  operator_delete__(__s);
  return;
}

Assistant:

void EDCircles::choldc(double ** a, int n, double ** l)
{
	int i, j, k;
	double sum;
	double *p = new double[n + 1];
	memset(p, 0, sizeof(double)*(n + 1));


	for (i = 1; i <= n; i++)
	{
		for (j = i; j <= n; j++)
		{
			for (sum = a[i][j], k = i - 1; k >= 1; k--) sum -= a[i][k] * a[j][k];
			if (i == j)
			{
				if (sum <= 0.0)
					// printf("\nA is not poitive definite!");
				{
				}
				else
					p[i] = sqrt(sum);
			}
			else
			{
				a[j][i] = sum / p[i];
			}
		}
	}
	for (i = 1; i <= n; i++) {
		for (j = i; j <= n; j++) {
			if (i == j)
				l[i][i] = p[i];
			else
			{
				l[j][i] = a[j][i];
				l[i][j] = 0.0;
			}
		} //end-for-inner
	} // end-for-outer

	delete[] p;
}